

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_job_queue_get_heap_layout
                    (ma_job_queue_config *pConfig,ma_job_queue_heap_layout *pHeapLayout)

{
  uint uVar1;
  ma_result mVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (pHeapLayout != (ma_job_queue_heap_layout *)0x0) {
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->allocatorOffset = 0;
    pHeapLayout->jobsOffset = 0;
  }
  mVar2 = MA_INVALID_ARGS;
  if (pConfig != (ma_job_queue_config *)0x0) {
    uVar1 = pConfig->capacity;
    uVar3 = (ulong)uVar1;
    if (uVar3 != 0) {
      sVar4 = (uVar3 * 4 + 7 & 0xfffffffffffffff8) +
              (ulong)((((uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0)) * 4 + 7 & 0xfffffff8);
      pHeapLayout->allocatorOffset = 0;
      pHeapLayout->jobsOffset = sVar4;
      pHeapLayout->sizeInBytes = uVar3 * 0x68 + sVar4;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

static MA_INLINE void ma_zero_memory_default(void* p, size_t sz)
{
    if (p == NULL) {
        MA_ASSERT(sz == 0); /* If this is triggered there's an error with the calling code. */
        return;
    }

    if (sz > 0) {
        memset(p, 0, sz);
    }
}